

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

void __thiscall
fmt::v8::detail::fill_t<char>::operator=(fill_t<char> *this,basic_string_view<char> s)

{
  size_t sVar1;
  char *pcVar2;
  size_t local_30;
  size_t i;
  size_t size;
  fill_t<char> *this_local;
  basic_string_view<char> s_local;
  
  s_local.data_ = (char *)s.size_;
  this_local = (fill_t<char> *)s.data_;
  sVar1 = basic_string_view<char>::size((basic_string_view<char> *)&this_local);
  if (sVar1 < 5) {
    for (local_30 = 0; local_30 < sVar1; local_30 = local_30 + 1) {
      pcVar2 = basic_string_view<char>::operator[]((basic_string_view<char> *)&this_local,local_30);
      this->data_[local_30] = *pcVar2;
    }
    this->size_ = (uchar)sVar1;
  }
  else {
    throw_format_error("invalid fill");
  }
  return;
}

Assistant:

FMT_CONSTEXPR void operator=(basic_string_view<Char> s) {
    auto size = s.size();
    if (size > max_size) return throw_format_error("invalid fill");
    for (size_t i = 0; i < size; ++i) data_[i] = s[i];
    size_ = static_cast<unsigned char>(size);
  }